

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTranslate.cpp
# Opt level: O3

void TranslateContinue(ExpressionTranslateContext *ctx,ExprContinue *expression)

{
  uint uVar1;
  ExprBase *expression_00;
  uint uVar2;
  
  expression_00 = expression->closures;
  if (((expression_00 != (ExprBase *)0x0) && (expression_00->typeID == 0x37)) &&
     (expression_00[1].typeID != 0)) {
    Translate(ctx,expression_00);
    Print(ctx,";");
    OutputContext::Print(ctx->output,"\n",1);
    PrintIndent(ctx);
  }
  uVar1 = (ctx->loopContinueIdStack).count;
  uVar2 = uVar1 - *(int *)&(expression->super_ExprBase).field_0x2c;
  if (uVar2 < uVar1) {
    Print(ctx,"goto continue_%d;",(ulong)(ctx->loopContinueIdStack).data[uVar2]);
    return;
  }
  __assert_fail("index < count",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h",
                0x199,
                "T &SmallArray<unsigned int, 32>::operator[](unsigned int) [T = unsigned int, N = 32]"
               );
}

Assistant:

void TranslateContinue(ExpressionTranslateContext &ctx, ExprContinue *expression)
{
	if(ExprSequence *closures = getType<ExprSequence>(expression->closures))
	{
		if(!closures->expressions.empty())
		{
			Translate(ctx, expression->closures);
			Print(ctx, ";");
			PrintLine(ctx);
			PrintIndent(ctx);
		}
	}

	Print(ctx, "goto continue_%d;", ctx.loopContinueIdStack[ctx.loopContinueIdStack.size() - expression->depth]);
}